

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O3

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
compute_pairwise_distances<Gudhi::Euclidean_distance>
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  value_type vVar11;
  vector<double,_std::allocator<double>_> zeros;
  allocator_type local_5a;
  Euclidean_distance local_59;
  long local_58;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_48,(long)this->num_points,&local_5a);
  iVar6 = this->num_points;
  if (0 < iVar6) {
    iVar7 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&this->distances,&local_48);
      iVar7 = iVar7 + 1;
      iVar6 = this->num_points;
    } while (iVar7 < iVar6);
  }
  if (this->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Computing distances...",0x16);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    iVar6 = this->num_points;
  }
  if (0 < iVar6) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      local_50 = lVar9 + 1;
      iVar7 = ((int)local_50 * 100) / iVar6;
      if ((this->verbose == true) && (iVar7 % 10 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"\r",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%",1);
        std::ostream::flush();
        iVar6 = this->num_points;
      }
      lVar5 = (long)iVar6;
      lVar8 = lVar9;
      lVar3 = lVar10;
      if (lVar9 < lVar5) {
        do {
          local_58 = lVar3;
          pvVar1 = (this->point_cloud).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          vVar11 = Euclidean_distance::operator()
                             (&local_59,pvVar1 + lVar9,
                              (vector<float,_std::allocator<float>_> *)
                              ((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data + lVar10));
          pvVar2 = (this->distances).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(double *)
           (*(long *)&pvVar2[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + lVar8 * 8) = (double)vVar11;
          *(double *)
           (*(long *)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar10) + lVar9 * 8) = (double)vVar11;
          lVar8 = lVar8 + 1;
          iVar6 = this->num_points;
          lVar10 = lVar10 + 0x18;
          lVar3 = local_58;
        } while ((int)lVar8 < iVar6);
        lVar5 = (long)iVar6;
        lVar10 = local_58;
      }
      lVar10 = lVar10 + 0x18;
      lVar9 = local_50;
    } while (local_50 < lVar5);
  }
  if (this->verbose != false) {
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compute_pairwise_distances(Distance ref_distance) {
    std::vector<double> zeros(this->num_points);
    for (int i = 0; i < this->num_points; i++) distances.push_back(zeros);
    if (verbose) std::clog << "Computing distances..." << std::endl;
    for (int i = 0; i < this->num_points; i++) {
      int state = 100 * (i + 1) / this->num_points;
      if (verbose && state % 10 == 0) std::clog << "\r" << state << "%" << std::flush;
      for (int j = i; j < this->num_points; j++) {
        double dis = ref_distance(point_cloud[i], point_cloud[j]);
        distances[i][j] = dis;
        distances[j][i] = dis;
      }
    }
    if (verbose) std::clog << std::endl;
  }